

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  size_t sVar1;
  size_t sVar2;
  IStreamingReporter *pIVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  RunningTest *pRVar7;
  IMutableContext *pIVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  size_t sVar17;
  string redirectedCerr;
  string redirectedCout;
  TestCaseInfo testInfo;
  string local_2a0;
  string local_280;
  TestCaseInfo local_260;
  TestCaseStats local_180;
  
  sVar1 = (this->m_totals).assertions.passed;
  sVar2 = (this->m_totals).assertions.failed;
  sVar10 = (this->m_totals).testCases.passed;
  sVar14 = (this->m_totals).testCases.failed;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_260,&testCase->super_TestCaseInfo);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,&local_260);
  pRVar7 = (RunningTest *)operator_new(0x70);
  pRVar7->m_info = testCase;
  pRVar7->m_runStatus = RanAtLeastOneSection;
  (pRVar7->m_rootSection).m_state = Root;
  (pRVar7->m_rootSection).m_parent = (RunningSection *)0x0;
  (pRVar7->m_rootSection).m_name._M_dataplus._M_p = (pointer)&(pRVar7->m_rootSection).m_name.field_2
  ;
  pcVar4 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pRVar7->m_rootSection).m_name,pcVar4,
             pcVar4 + (testCase->super_TestCaseInfo).name._M_string_length);
  (pRVar7->m_rootSection).m_subSections.
  super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar7->m_rootSection).m_subSections.
  super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar7->m_rootSection).m_subSections.
  super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar7->m_currentSection = &pRVar7->m_rootSection;
  pRVar7->m_changed = false;
  this->m_runningTest = pRVar7;
LAB_00145b14:
  do {
    runCurrentTest(this,&local_280,&local_2a0);
    pRVar7 = this->m_runningTest;
    if ((pRVar7->m_runStatus == RanAtLeastOneSection) ||
       ((bVar5 = RunningSection::hasUntestedSections(&pRVar7->m_rootSection), bVar5 &&
        (pRVar7->m_changed == true)))) {
      sVar17 = (this->m_totals).assertions.failed;
      iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
      if (sVar17 != (long)iVar6) goto LAB_00145b14;
    }
    pIVar8 = getCurrentMutableContext();
    iVar6 = (*(pIVar8->super_IContext)._vptr_IContext[5])(pIVar8);
    if (((char)iVar6 == '\0') ||
       (sVar17 = (this->m_totals).assertions.failed,
       iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])(),
       sVar17 == (long)iVar6)) break;
  } while( true );
  sVar17 = (this->m_totals).assertions.failed;
  sVar9 = (this->m_totals).assertions.passed - sVar1;
  (__return_storage_ptr__->assertions).passed = sVar9;
  (__return_storage_ptr__->assertions).failed = sVar17 - sVar2;
  sVar12 = (this->m_totals).testCases.passed;
  sVar11 = (this->m_totals).testCases.failed;
  sVar13 = sVar12 - sVar10;
  sVar15 = sVar11 - sVar14;
  lVar16 = sVar17 - sVar2;
  (__return_storage_ptr__->testCases).passed = sVar13;
  (__return_storage_ptr__->testCases).failed = sVar15;
  if (lVar16 == 0) {
    sVar15 = sVar13;
  }
  (&(__return_storage_ptr__->testCases).passed)[lVar16 != 0] = sVar15 + 1;
  if (lVar16 + sVar9 == 0) {
    iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[9])();
    sVar17 = (this->m_totals).assertions.failed;
    sVar12 = (this->m_totals).testCases.passed;
    sVar11 = (this->m_totals).testCases.failed;
    if ((char)iVar6 != '\0') {
      sVar17 = sVar17 + 1;
      sVar10 = sVar12 - sVar10;
      sVar14 = sVar11 - sVar14;
      sVar15 = sVar14;
      if (sVar17 == sVar2) {
        sVar15 = sVar10;
      }
      (this->m_totals).assertions.failed = sVar17;
      sVar9 = sVar15 + 1;
      if (sVar17 - sVar2 != 0) {
        sVar9 = sVar10;
        sVar14 = sVar15 + 1;
      }
      (__return_storage_ptr__->assertions).passed = (this->m_totals).assertions.passed - sVar1;
      (__return_storage_ptr__->assertions).failed = sVar17 - sVar2;
      (__return_storage_ptr__->testCases).passed = sVar9;
      (__return_storage_ptr__->testCases).failed = sVar14;
      bVar5 = true;
      goto LAB_00145c6e;
    }
  }
  bVar5 = false;
LAB_00145c6e:
  (this->m_totals).testCases.passed = sVar12 + (__return_storage_ptr__->testCases).passed;
  (this->m_totals).testCases.failed = sVar11 + (__return_storage_ptr__->testCases).failed;
  pIVar3 = (this->m_reporter).m_p;
  iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
  TestCaseStats::TestCaseStats
            (&local_180,&local_260,__return_storage_ptr__,&local_280,&local_2a0,bVar5,
             sVar17 == (long)iVar6);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,&local_180);
  TestCaseStats::~TestCaseStats(&local_180);
  pRVar7 = this->m_runningTest;
  if (pRVar7 != (RunningTest *)0x0) {
    RunningSection::~RunningSection(&pRVar7->m_rootSection);
  }
  operator_delete(pRVar7);
  this->m_runningTest = (RunningTest *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.lineInfo.file._M_dataplus._M_p != &local_260.lineInfo.file.field_2) {
    operator_delete(local_260.lineInfo.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.tagsAsString._M_dataplus._M_p != &local_260.tagsAsString.field_2) {
    operator_delete(local_260.tagsAsString._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_260.tags._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.description._M_dataplus._M_p != &local_260.description.field_2) {
    operator_delete(local_260.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.className._M_dataplus._M_p != &local_260.className.field_2) {
    operator_delete(local_260.className._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.name._M_dataplus._M_p != &local_260.name.field_2) {
    operator_delete(local_260.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_runningTest = new RunningTest( testCase );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( m_runningTest->hasUntestedSections() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            bool missingAssertions = false;
            if( deltaTotals.assertions.total() == 0  && m_config->warnAboutMissingAssertions() ) {
                m_totals.assertions.failed++;
                deltaTotals = m_totals.delta( prevTotals );
                missingAssertions = true;
            }

            m_totals.testCases += deltaTotals.testCases;

            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        missingAssertions,
                                                        aborting() ) );

            delete m_runningTest;
            m_runningTest = NULL;

            return deltaTotals;
        }